

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O3

void __thiscall skiwi::anon_unknown_23::case_examples::~case_examples(case_examples *this)

{
  compile_fixture::~compile_fixture(&this->super_compile_fixture);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      build_string_to_symbol();
      TEST_EQ("big", run("(case (+ 7 5) [(1 2 3) 'small] [(10 11 12) 'big])"));
      TEST_EQ("75", run("(case (+ 7 3) [(10 11 12) 75])"));
      TEST_EQ("small", run("(case (- 7 5) [(1 2 3) 'small] [(10 11 12) 'big])"));

      TEST_EQ("composite", run("(case (* 2 3) [(2 3 5 7) 'prime][(1 4 6 8 9) 'composite])"));
      TEST_EQ("#undefined", run("(case (car '(c d)) [(a) 'a] [(b) 'b])"));
      TEST_EQ("consonant", run("(case (car '(c d)) [(a e i o u) 'vowel][(w y) 'semivowel][else 'consonant])"));
      TEST_EQ("vowel", run("(case (car '(e d)) [(a e i o u) 'vowel][(w y) 'semivowel][else 'consonant])"));

      //TEST_EQ("backwards", run("(case (list 'y 'x) [((a b) (x y)) 'forwards]  [((b a) (y x)) 'backwards])")); // this only works if case is rewritten with member instead of memv
      TEST_EQ("5", run("(let ([x 3]) (case x [else 5]))"));

      TEST_EQ("5", run("(let ([x #\\a]) (case x [(#\\newline) 7] [else 5]))"));
      TEST_EQ("5", run("(let ([x #\\a]) (case x [(#\\newline) (char->fixnum x)] [else 5]))"));
      TEST_EQ("10", run("(let ([x #\\newline]) (case x [(#\\newline) (char->fixnum x)] [else 5]))"));
      TEST_EQ("#t", run("(let ([x #\\newline]) (eqv? x #\\newline))"));
      TEST_EQ("(#\\010)", run("(let ([x #\\newline]) (memv x '(#\\newline)))"));
      }